

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

int __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::size(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = (((((this->left_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar1 = (((((this->left_->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_Fad<double>_>
          ::size(&this->right_->fadexpr_);
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }